

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

uint32 __thiscall crnlib::ranctx::next(ranctx *this)

{
  int iVar1;
  uint32 e;
  ranctx *this_local;
  
  iVar1 = this->a - (this->b << 0x1b | this->b >> 5);
  this->a = this->b ^ (this->c << 0x11 | this->c >> 0xf);
  this->b = this->c + this->d;
  this->c = this->d + iVar1;
  this->d = iVar1 + this->a;
  return this->d;
}

Assistant:

inline uint32 ranctx::next()
    {
        uint32 e = a - rot(b, 27);
        a = b ^ rot(c, 17);
        b = c + d;
        c = d + e;
        d = e + a;
        return d;
    }